

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell.cc
# Opt level: O2

S1ChordAngle __thiscall S2Cell::GetDistance(S2Cell *this,S2Point *a,S2Point *b)

{
  S2Point *pSVar1;
  int iVar2;
  S2Point *pSVar3;
  int i;
  long lVar4;
  S1ChordAngle SVar5;
  S1ChordAngle SVar6;
  S1ChordAngle min_dist;
  S2Point v [4];
  S2EdgeCrosser crosser;
  S1ChordAngle local_110;
  S2Point local_108;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  S2Point SStack_c0;
  S2EdgeCrosser local_a0;
  
  SVar5 = GetDistance(this,a);
  SVar6 = GetDistance(this,b);
  if (SVar5.length2_ <= SVar6.length2_) {
    SVar6 = SVar5;
  }
  local_110.length2_ = SVar6.length2_;
  SVar5 = S1ChordAngle::Zero();
  if ((SVar6.length2_ != SVar5.length2_) || (NAN(SVar6.length2_) || NAN(SVar5.length2_))) {
    pSVar3 = &local_108;
    SStack_c0.c_[1] = 0.0;
    SStack_c0.c_[2] = 0.0;
    local_c8 = 0;
    SStack_c0.c_[0] = 0.0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_e8 = 0;
    uStack_e0 = 0;
    local_108.c_[2] = 0.0;
    uStack_f0 = 0;
    local_108.c_[0] = 0.0;
    local_108.c_[1] = 0.0;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      GetVertex((S2Point *)&local_a0,this,(int)lVar4);
      pSVar3->c_[2] = local_a0.a_cross_b_.c_[0];
      pSVar1 = local_a0.b_;
      pSVar3->c_[0] = (VType)local_a0.a_;
      pSVar3->c_[1] = (VType)pSVar1;
      pSVar3 = pSVar3 + 1;
    }
    S2EdgeCrosser::S2EdgeCrosser(&local_a0,a,b,&SStack_c0);
    lVar4 = 0;
    do {
      if (lVar4 + 0x18 == 0x78) {
        for (lVar4 = 0; lVar4 != 0x60; lVar4 = lVar4 + 0x18) {
          S2::UpdateMinDistance((S2Point *)((long)local_108.c_ + lVar4),a,b,&local_110);
        }
        return (S1ChordAngle)local_110.length2_;
      }
      iVar2 = S2EdgeCrosser::CrossingSign(&local_a0,(S2Point *)((long)local_108.c_ + lVar4));
      lVar4 = lVar4 + 0x18;
    } while (iVar2 < 0);
    SVar6 = S1ChordAngle::Zero();
  }
  return (S1ChordAngle)SVar6.length2_;
}

Assistant:

S1ChordAngle S2Cell::GetDistance(const S2Point& a, const S2Point& b) const {
  // Possible optimizations:
  //  - Currently the (cell vertex, edge endpoint) distances are computed
  //    twice each, and the length of AB is computed 4 times.
  //  - To fix this, refactor GetDistance(target) so that it skips calculating
  //    the distance to each cell vertex.  Instead, compute the cell vertices
  //    and distances in this function, and add a low-level UpdateMinDistance
  //    that allows the XA, XB, and AB distances to be passed in.
  //  - It might also be more efficient to do all calculations in UVW-space,
  //    since this would involve transforming 2 points rather than 4.

  // First, check the minimum distance to the edge endpoints A and B.
  // (This also detects whether either endpoint is inside the cell.)
  S1ChordAngle min_dist = min(GetDistance(a), GetDistance(b));
  if (min_dist == S1ChordAngle::Zero()) return min_dist;

  // Otherwise, check whether the edge crosses the cell boundary.
  // Note that S2EdgeCrosser needs pointers to vertices.
  S2Point v[4];
  for (int i = 0; i < 4; ++i) {
    v[i] = GetVertex(i);
  }
  S2EdgeCrosser crosser(&a, &b, &v[3]);
  for (int i = 0; i < 4; ++i) {
    if (crosser.CrossingSign(&v[i]) >= 0) {
      return S1ChordAngle::Zero();
    }
  }
  // Finally, check whether the minimum distance occurs between a cell vertex
  // and the interior of the edge AB.  (Some of this work is redundant, since
  // it also checks the distance to the endpoints A and B again.)
  //
  // Note that we don't need to check the distance from the interior of AB to
  // the interior of a cell edge, because the only way that this distance can
  // be minimal is if the two edges cross (already checked above).
  for (int i = 0; i < 4; ++i) {
    S2::UpdateMinDistance(v[i], a, b, &min_dist);
  }
  return min_dist;
}